

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

DdGen * Cudd_FirstCube(DdManager *dd,DdNode *f,int **cube,double *value)

{
  undefined8 uVar1;
  uint uVar2;
  DdNode *pDVar3;
  DdGen *__ptr;
  int *__ptr_00;
  ulong uVar4;
  DdNode **ppDVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  DdNode *pDVar9;
  DdNode *pDVar10;
  DdNode *pDVar11;
  DdNode *pDVar12;
  long lVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  
  if (f != (DdNode *)0x0 && dd != (DdManager *)0x0) {
    __ptr = (DdGen *)malloc(0x38);
    if (__ptr == (DdGen *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      __ptr->manager = dd;
      __ptr->type = 0;
      __ptr->status = 0;
      (__ptr->gen).cubes.cube = (int *)0x0;
      *(undefined8 *)((long)&(__ptr->gen).cubes.cube + 4) = 0;
      *(undefined8 *)((long)&(__ptr->gen).cubes.value + 4) = 0;
      (__ptr->stack).stack = (DdNode **)0x0;
      __ptr->node = (DdNode *)0x0;
      uVar2 = dd->size;
      lVar13 = (long)(int)uVar2;
      __ptr_00 = (int *)malloc(lVar13 * 4);
      (__ptr->gen).cubes.cube = __ptr_00;
      if (__ptr_00 == (int *)0x0) {
        dd->errorCode = CUDD_MEMORY_OUT;
      }
      else {
        uVar4 = 0;
        uVar7 = 0;
        if (0 < (int)uVar2) {
          uVar7 = (ulong)uVar2;
        }
        for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
          __ptr_00[uVar4] = 2;
        }
        ppDVar5 = (DdNode **)malloc(lVar13 * 8 + 8);
        (__ptr->stack).stack = ppDVar5;
        if (ppDVar5 != (DdNode **)0x0) {
          for (lVar8 = 0; lVar8 <= lVar13; lVar8 = lVar8 + 1) {
            ppDVar5[lVar8] = (DdNode *)0x0;
          }
          *ppDVar5 = f;
          iVar6 = 1;
          while( true ) {
            while( true ) {
              lVar13 = (long)iVar6;
              pDVar9 = ppDVar5[lVar13 + -1];
              pDVar10 = (DdNode *)((ulong)pDVar9 & 0xfffffffffffffffe);
              if ((ulong)pDVar10->index == 0x7fffffff) break;
              __ptr_00[pDVar10->index] = 0;
              pDVar3 = (pDVar10->type).kids.E;
              pDVar11 = (DdNode *)((ulong)pDVar3 ^ 1);
              if (pDVar9 == pDVar10) {
                pDVar11 = pDVar3;
              }
              ppDVar5[lVar13] = pDVar11;
              iVar6 = iVar6 + 1;
            }
            if ((pDVar9 != (DdNode *)((ulong)dd->one ^ 1)) && (pDVar9 != dd->background)) break;
            lVar13 = lVar13 + -1;
            while( true ) {
              if (lVar13 == 0) {
                __ptr->status = 0;
                (__ptr->stack).sp = 0;
                uVar1 = *(undefined8 *)((long)&__ptr->gen + 8);
                uVar14 = (undefined4)uVar1;
                uVar15 = (undefined4)((ulong)uVar1 >> 0x20);
                goto LAB_006334ab;
              }
              pDVar10 = ppDVar5[lVar13 + -1];
              pDVar12 = (DdNode *)((ulong)pDVar10 & 0xfffffffffffffffe);
              pDVar3 = (pDVar12->type).kids.T;
              pDVar11 = (DdNode *)((ulong)pDVar3 ^ 1);
              if (pDVar10 == pDVar12) {
                pDVar11 = pDVar3;
              }
              if (pDVar11 != pDVar9) break;
              __ptr_00[pDVar12->index] = 2;
              iVar6 = iVar6 + -1;
              pDVar9 = pDVar10;
              lVar13 = lVar13 + -1;
            }
            __ptr_00[pDVar12->index] = 1;
            ppDVar5[lVar13] = pDVar11;
          }
          (__ptr->stack).sp = iVar6;
          __ptr->status = 1;
          uVar1 = *(undefined8 *)&pDVar9->type;
          uVar14 = (undefined4)uVar1;
          uVar15 = (undefined4)((ulong)uVar1 >> 0x20);
          *(undefined8 *)((long)&__ptr->gen + 8) = uVar1;
LAB_006334ab:
          *cube = __ptr_00;
          *value = (double)CONCAT44(uVar15,uVar14);
          return __ptr;
        }
        dd->errorCode = CUDD_MEMORY_OUT;
        free(__ptr_00);
      }
      free(__ptr);
    }
  }
  return (DdGen *)0x0;
}

Assistant:

DdGen *
Cudd_FirstCube(
  DdManager * dd,
  DdNode * f,
  int ** cube,
  CUDD_VALUE_TYPE * value)
{
    DdGen *gen;
    DdNode *top, *treg, *next, *nreg, *prev, *preg;
    int i;
    int nvars;

    /* Sanity Check. */
    if (dd == NULL || f == NULL) return(NULL);

    /* Allocate generator an initialize it. */
    gen = ABC_ALLOC(DdGen,1);
    if (gen == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    gen->manager = dd;
    gen->type = CUDD_GEN_CUBES;
    gen->status = CUDD_GEN_EMPTY;
    gen->gen.cubes.cube = NULL;
    gen->gen.cubes.value = DD_ZERO_VAL;
    gen->stack.sp = 0;
    gen->stack.stack = NULL;
    gen->node = NULL;

    nvars = dd->size;
    gen->gen.cubes.cube = ABC_ALLOC(int,nvars);
    if (gen->gen.cubes.cube == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen);
        return(NULL);
    }
    for (i = 0; i < nvars; i++) gen->gen.cubes.cube[i] = 2;

    /* The maximum stack depth is one plus the number of variables.
    ** because a path may have nodes at all levels, including the
    ** constant level.
    */
    gen->stack.stack = ABC_ALLOC(DdNodePtr, nvars+1);
    if (gen->stack.stack == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(gen->gen.cubes.cube);
        ABC_FREE(gen);
        return(NULL);
    }
    for (i = 0; i <= nvars; i++) gen->stack.stack[i] = NULL;

    /* Find the first cube of the onset. */
    gen->stack.stack[gen->stack.sp] = f; gen->stack.sp++;

    while (1) {
        top = gen->stack.stack[gen->stack.sp-1];
        treg = Cudd_Regular(top);
        if (!cuddIsConstant(treg)) {
            /* Take the else branch first. */
            gen->gen.cubes.cube[treg->index] = 0;
            next = cuddE(treg);
            if (top != treg) next = Cudd_Not(next);
            gen->stack.stack[gen->stack.sp] = next; gen->stack.sp++;
        } else if (top == Cudd_Not(DD_ONE(dd)) || top == dd->background) {
            /* Backtrack */
            while (1) {
                if (gen->stack.sp == 1) {
                    /* The current node has no predecessor. */
                    gen->status = CUDD_GEN_EMPTY;
                    gen->stack.sp--;
                    goto done;
                }
                prev = gen->stack.stack[gen->stack.sp-2];
                preg = Cudd_Regular(prev);
                nreg = cuddT(preg);
                if (prev != preg) {next = Cudd_Not(nreg);} else {next = nreg;}
                if (next != top) { /* follow the then branch next */
                    gen->gen.cubes.cube[preg->index] = 1;
                    gen->stack.stack[gen->stack.sp-1] = next;
                    break;
                }
                /* Pop the stack and try again. */
                gen->gen.cubes.cube[preg->index] = 2;
                gen->stack.sp--;
                top = gen->stack.stack[gen->stack.sp-1];
                treg = Cudd_Regular(top);
            }
        } else {
            gen->status = CUDD_GEN_NONEMPTY;
            gen->gen.cubes.value = cuddV(top);
            goto done;
        }
    }

done:
    *cube = gen->gen.cubes.cube;
    *value = gen->gen.cubes.value;
    return(gen);

}